

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O0

int stmm_insert(stmm_table *table,char *key,char *value)

{
  int iVar1;
  stmm_table_entry *psVar2;
  bool bVar3;
  int local_60;
  int local_5c;
  int local_50;
  int local_4c;
  stmm_table_entry **local_48;
  stmm_table_entry **last;
  stmm_table_entry *ptr;
  stmm_table_entry *newEntry;
  int hash_val;
  char *value_local;
  char *key_local;
  stmm_table *table_local;
  
  if (table->hash == stmm_ptrhash) {
    local_4c = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
  }
  else {
    if (table->hash == stmm_numhash) {
      local_50 = Abc_AbsInt((int)key);
      local_50 = local_50 % table->num_bins;
    }
    else {
      local_50 = (*table->hash)(key,table->num_bins);
    }
    local_4c = local_50;
  }
  newEntry._4_4_ = local_4c;
  local_48 = table->bins + local_4c;
  last = (stmm_table_entry **)*local_48;
  while( true ) {
    bVar3 = false;
    if (last != (stmm_table_entry **)0x0) {
      if ((table->compare == stmm_numcmp) || (table->compare == stmm_ptrcmp)) {
        bVar3 = (stmm_table_entry *)key == *last;
      }
      else {
        iVar1 = (*table->compare)(key,(char *)*last);
        bVar3 = iVar1 == 0;
      }
      bVar3 = !bVar3;
    }
    if (!bVar3) break;
    local_48 = last + 2;
    last = (stmm_table_entry **)*local_48;
  }
  if ((last != (stmm_table_entry **)0x0) && (table->reorder_flag != 0)) {
    *local_48 = last[2];
    last[2] = table->bins[local_4c];
    table->bins[local_4c] = (stmm_table_entry *)last;
  }
  if (last == (stmm_table_entry **)0x0) {
    if (table->max_density <= table->num_entries / table->num_bins) {
      iVar1 = rehash(table);
      if (iVar1 == -10000) {
        return -10000;
      }
      if (table->hash == stmm_ptrhash) {
        local_5c = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
      }
      else {
        if (table->hash == stmm_numhash) {
          local_60 = Abc_AbsInt((int)key);
          local_60 = local_60 % table->num_bins;
        }
        else {
          local_60 = (*table->hash)(key,table->num_bins);
        }
        local_5c = local_60;
      }
      newEntry._4_4_ = local_5c;
    }
    psVar2 = (stmm_table_entry *)Extra_MmFixedEntryFetch((Extra_MmFixed_t *)table->pMemMan);
    if (psVar2 == (stmm_table_entry *)0x0) {
      table_local._4_4_ = -10000;
    }
    else {
      psVar2->key = key;
      psVar2->record = value;
      psVar2->next = table->bins[newEntry._4_4_];
      table->bins[newEntry._4_4_] = psVar2;
      table->num_entries = table->num_entries + 1;
      table_local._4_4_ = 0;
    }
  }
  else {
    last[1] = (stmm_table_entry *)value;
    table_local._4_4_ = 1;
  }
  return table_local._4_4_;
}

Assistant:

int
stmm_insert (stmm_table *table, char *key, char *value)
{
    int hash_val;
    stmm_table_entry *newEntry;
    stmm_table_entry *ptr, **last;

    hash_val = do_hash (key, table);

    FIND_ENTRY (table, hash_val, key, ptr, last);

    if (ptr == NULL) {
    if (table->num_entries / table->num_bins >= table->max_density) {
        if (rehash (table) == STMM_OUT_OF_MEM) {
        return STMM_OUT_OF_MEM;
        }
        hash_val = do_hash (key, table);
    }

//              newEntry = ABC_ALLOC( stmm_table_entry, 1 );
    newEntry = (stmm_table_entry *) Extra_MmFixedEntryFetch ((Extra_MmFixed_t *)table->pMemMan);
    if (newEntry == NULL) {
        return STMM_OUT_OF_MEM;
    }

    newEntry->key = key;
    newEntry->record = value;
    newEntry->next = table->bins[hash_val];
    table->bins[hash_val] = newEntry;
    table->num_entries++;
    return 0;
    }
    else {
    ptr->record = value;
    return 1;
    }
}